

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlSchema.cpp
# Opt level: O2

void __thiscall opencollada::XmlSchema::~XmlSchema(XmlSchema *this)

{
  if (this->mSchema != (xmlSchemaPtr)0x0) {
    xmlSchemaFree();
    this->mSchema = (xmlSchemaPtr)0x0;
  }
  Uri::~Uri(&this->mUri);
  return;
}

Assistant:

XmlSchema::~XmlSchema()
	{
		if (mSchema)
		{
			xmlSchemaFree(mSchema);
			mSchema = nullptr;
		}
	}